

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_h265e_vepu511.c
# Opt level: O1

MPP_RET hal_h265e_vepu511_gen_regs(void *hal,HalEncTask *task)

{
  MppBuffer *buffer;
  byte bVar1;
  undefined1 uVar2;
  RK_U8 RVar3;
  ushort uVar4;
  undefined2 uVar5;
  undefined2 uVar6;
  void *__s;
  long lVar7;
  EncRcTask *pEVar8;
  void *pvVar9;
  MppBuffer buffer_00;
  MppDevRegOffCfgs *pMVar10;
  EncRcTask *pEVar11;
  byte bVar12;
  int iVar13;
  RK_U32 RVar14;
  MppFrameFormat MVar15;
  RK_U32 offset;
  int iVar16;
  MPP_RET MVar17;
  HalBuf *pHVar18;
  HalBuf *pHVar19;
  size_t sVar20;
  byte *pbVar21;
  ulong uVar22;
  long lVar23;
  uint *puVar24;
  short sVar25;
  uint uVar26;
  uint uVar27;
  uint uVar28;
  uint uVar29;
  H265eV511HalContext *ctx;
  uint uVar30;
  uint uVar31;
  undefined4 uVar32;
  uint uVar33;
  long lVar34;
  long lVar35;
  RK_U32 *pRVar36;
  uint uVar37;
  uint uVar38;
  uint uVar39;
  uint uVar40;
  uint uVar41;
  uint uVar42;
  Vepu511ControlCfg *reg_ctl;
  ushort uVar43;
  HalEncTask *enc_task;
  
  __s = *(void **)(*(long *)((long)hal + 0x90) + 0x18);
  lVar7 = *(long *)((long)hal + 0x3c0);
  puVar24 = *(uint **)((long)hal + 0x3e0);
  pEVar8 = task->rc_task;
  if (((byte)hal_h265e_debug & 4) != 0) {
    _mpp_log_l(4,"hal_h265e_v511","(%d) enter\n",(char *)0x0,0x888);
  }
  if (((byte)hal_h265e_debug & 2) != 0) {
    _mpp_log_l(4,"hal_h265e_v511","frame %d | type %d | start gen regs11",
               "hal_h265e_vepu511_gen_regs",(ulong)*(uint *)((long)hal + 0x3fc),
               (ulong)*(uint *)((long)hal + 0x374));
  }
  memset(__s,0,0x18d0);
  uVar37 = *(uint *)((long)__s + 0x10);
  *(uint *)((long)__s + 0x10) = uVar37 & 0xffffff00;
  *(uint *)((long)__s + 0x10) = uVar37 & 0xfffff800 | (*(uint *)((long)hal + 0x3d0) & 7) << 8;
  *(byte *)((long)__s + 0x14) = *(byte *)((long)__s + 0x14) & 0xfc;
  *(undefined2 *)((long)__s + 0x20) = 0x7fff;
  *(byte *)((long)__s + 0x28) = *(byte *)((long)__s + 0x28) | 1;
  *(undefined4 *)((long)__s + 0x30) = 0x7007;
  *(uint *)((long)__s + 0x34) = *(uint *)((long)__s + 0x34) | 0x3ff0000;
  *(uint *)((long)__s + 0x38) = (uint)*(byte *)((long)__s + 0x3b) << 0x18;
  *(uint *)((long)__s + 0x54) = *(uint *)((long)__s + 0x54) & 0xfffffff0 | 5;
  *(undefined4 *)((long)__s + 0x58) = 0;
  pvVar9 = (task->syntax).data;
  iVar13 = *(int *)(*(long *)((long)hal + 0x3b0) + 0x1864);
  if (((byte)hal_h265e_debug & 4) != 0) {
    _mpp_log_l(4,"hal_h265e_v511","(%d) enter\n",(char *)0x0,0x364);
  }
  uVar43 = *(ushort *)((long)pvVar9 + 4);
  uVar4 = *(ushort *)((long)pvVar9 + 6);
  *(uint *)((long)__s + 0x1c4) =
       (uint)uVar4 * 0x2000 + 0x7ffe000 & 0x7ff0000 |
       *(uint *)((long)__s + 0x1c4) & 0xf800f800 | (uVar43 + 7 >> 3) - 1 & 0x7ff;
  uVar26 = *(ushort *)((long)pvVar9 + 4) & 7;
  uVar37 = 8 - uVar26;
  if ((*(ushort *)((long)pvVar9 + 4) & 7) == 0) {
    uVar37 = uVar26;
  }
  uVar37 = *(uint *)((long)__s + 0x1c8) & 0xffffffc0 | uVar37;
  *(uint *)((long)__s + 0x1c8) = uVar37;
  uVar30 = *(ushort *)((long)pvVar9 + 6) & 7;
  uVar26 = (8 - uVar30) * 0x10000;
  if ((*(ushort *)((long)pvVar9 + 6) & 7) == 0) {
    uVar26 = uVar30;
  }
  *(uint *)((long)__s + 0x1c8) = uVar37 & 0xffc0ffcf | uVar26;
  uVar37 = (*(uint *)((long)__s + 0x1b4) & 0xfffffffc) + 1;
  *(uint *)((long)__s + 0x1b4) = uVar37;
  *(uint *)((long)__s + 0x1b4) =
       (uVar37 & 0xffffffe9) + (uint)(*(int *)((long)pvVar9 + 0x120) == 0) * 4 + 0x10;
  uVar37 = mpp_log2((uVar43 + 0x1f >> 4 & 0xfffffffe) * (uVar4 + 0x1f >> 5) - 2);
  uVar30 = (uVar37 & 0x1f) << 0x13;
  uVar37 = *(uint *)((long)__s + 0x1b4);
  *(uint *)((long)__s + 0x1b4) = uVar37 & 0xff07ffff | uVar30;
  uVar26 = 6;
  if (*(int *)((long)hal + 0x374) != 2) {
    uVar26 = (uint)(iVar13 == 1) * 3 + 6;
  }
  *(uint *)((long)__s + 0x46c) = *(uint *)((long)__s + 0x46c) & 0xfffffff0 | uVar26;
  *(uint *)((long)__s + 0x1b4) = uVar37 & 0x7e07ffff | uVar30;
  uVar37 = *(uint *)((long)__s + 0x254);
  *(uint *)((long)__s + 0x254) = uVar37 & 0xffff8003 | 0x2d0;
  *(undefined1 *)((long)__s + 600) = 0x55;
  uVar26 = uVar37 & 0xff7f8000 | 0x2d0;
  uVar37 = uVar26 + 2;
  if (*(char *)((long)pvVar9 + 0x1e) == '\0') {
    uVar37 = uVar26;
  }
  *(uint *)((long)__s + 0x254) = uVar37 | 0x800000;
  *(uint *)((long)__s + 0x254) =
       uVar37 & 0xfcff82d2 | 0x800000 | (*(uint *)((long)pvVar9 + 0x24) & 1) << 0x18;
  uVar37 = 1;
  if (*(int *)((long)hal + 0x374) == 2) {
    uVar37 = 0x13;
  }
  *(uint *)((long)__s + 0x264) = *(uint *)((long)__s + 0x264) & 0xffffffc0 | uVar37;
  *(undefined2 *)((long)__s + 0x224) = 0xccff;
  *(uint *)((long)__s + 0x228) = *(uint *)((long)__s + 0x228) & 0x88000000 | 0xf20048;
  *(undefined4 *)((long)__s + 0x224) = 0x1ccff;
  if (((*(byte *)(lVar7 + 0x26) & 4) != 0) && (*(int *)((long)hal + 0x374) != 2)) {
    *(uint *)((long)__s + 0x22c) =
         (uint)(*(int *)((long)hal + 0x21c) != 2) * -0x80000000 +
         (*(uint *)((long)__s + 0x22c) & 0x3fffffff) + 0x40000000;
  }
  *(uint *)((long)__s + 0x22c) = *(uint *)((long)__s + 0x22c) & 0xcfffe000 | 0x40;
  *(uint *)((long)__s + 0x5b4) = *(uint *)((long)__s + 0x5b4) & 0xffff000c | 0x8023;
  *(uint *)((long)__s + 0x5b8) = *(uint *)((long)__s + 0x5b8) & 0xe0080200 | 0x2005008;
  uVar30 = *(uint *)((long)__s + 0x5bc) & 0xfff00000;
  *(uint *)((long)__s + 0x5bc) = uVar30 + 0x88010;
  *(undefined4 *)((long)__s + 0x5c0) = 0x14100c08;
  uVar37 = *(uint *)((long)__s + 0x5c4) & 0xf000ff88 | 0x21;
  *(uint *)((long)__s + 0x5c4) = uVar37;
  uVar31 = *(uint *)((long)__s + 0x5c8) & 0xf000f000;
  *(uint *)((long)__s + 0x5c8) = uVar31 + 0x100008;
  uVar26 = *(uint *)((long)__s + 0x5cc) & 0xc0000000;
  *(uint *)((long)__s + 0x5cc) = uVar26 + 0xc02004;
  *(uint *)((long)__s + 0x5d0) = (uint)*(byte *)((long)__s + 0x5d3) << 0x18 | 0x806040;
  if (*(int *)(*(long *)((long)hal + 0x3b0) + 0x1864) == 1) {
    if (*(int *)((long)hal + 0x414) != 0) {
      uVar30 = 0x801804;
      uVar32 = 0xc080604;
      goto LAB_00262da3;
    }
  }
  else {
    *(uint *)((long)__s + 0x5bc) = uVar30 | 0x88000;
    *(uint *)((long)__s + 0x5c8) = uVar31;
    uVar30 = 0x401004;
    uVar32 = 0x4040404;
LAB_00262da3:
    *(undefined4 *)((long)__s + 0x5c0) = uVar32;
    *(uint *)((long)__s + 0x5cc) = uVar26 | uVar30;
  }
  *(uint *)((long)__s + 0x5c4) = uVar37;
  *(uint *)((long)__s + 0x5cc) = *(uint *)((long)__s + 0x5cc) & 0xc0000000;
  lVar23 = *(long *)((long)hal + 0x3b0);
  if (((byte)hal_h265e_debug & 1) != 0) {
    _mpp_log_l(4,"hal_h265e_v511","enter\n","vepu511_h265_set_split");
  }
  iVar13 = *(int *)(lVar23 + 0xe94);
  if (iVar13 == 2) {
    *(uint *)((long)__s + 0x214) = *(uint *)((long)__s + 0x214) & 0x80007ff8 | 0x1f48003;
    *(uint *)((long)__s + 0x21c) =
         *(uint *)((long)__s + 0x21c) & 0xfff00000 | *(int *)(lVar23 + 0xe98) - 1U & 0xfffff;
    *(uint *)((long)__s + 0x218) = *(uint *)((long)__s + 0x218) & 0xfff00000;
LAB_00262ec1:
    *(uint *)((long)__s + 0x1b4) =
         *(uint *)((long)__s + 0x1b4) & 0xbfffffff | (uint)(*(int *)(lVar23 + 0xe9c) != 0) << 0x1e;
    *(uint *)((long)__s + 0x20) =
         (*(uint *)((long)__s + 0x20) & 0xfffffff7) + (uint)(*(int *)(lVar23 + 0xe9c) != 0) * 8;
  }
  else {
    if (iVar13 == 1) {
      *(uint *)((long)__s + 0x214) = *(uint *)((long)__s + 0x214) & 0x80007ff8 | 0x1f48001;
      *(uint *)((long)__s + 0x21c) = *(uint *)((long)__s + 0x21c) & 0xfff00000;
      *(uint *)((long)__s + 0x218) =
           *(uint *)((long)__s + 0x218) & 0xfff00000 | *(uint *)(lVar23 + 0xe98) & 0xfffff;
      goto LAB_00262ec1;
    }
    if (iVar13 == 0) {
      *(uint *)((long)__s + 0x214) = *(uint *)((long)__s + 0x214) & 0x80007ff8;
      *(uint *)((long)__s + 0x21c) = *(uint *)((long)__s + 0x21c) & 0xfff00000;
      *(uint *)((long)__s + 0x218) = *(uint *)((long)__s + 0x218) & 0xfff00000;
      *(byte *)((long)__s + 0x1b7) = *(byte *)((long)__s + 0x1b7) & 0xbf;
    }
    else {
      _mpp_log_l(4,"hal_h265e_v511","invalide slice split mode %d\n","vepu511_h265_set_split");
    }
  }
  *(undefined4 *)(lVar23 + 0xe90) = 0;
  if (((byte)hal_h265e_debug & 1) != 0) {
    _mpp_log_l(4,"hal_h265e_v511","leave\n","vepu511_h265_set_split");
  }
  buffer_00 = task->md_info;
  lVar23 = *(long *)((long)hal + 0x90);
  lVar34 = *(long *)((long)hal + 0x3c0);
  if (((byte)hal_h265e_debug & 4) != 0) {
    _mpp_log_l(4,"hal_h265e_v511","(%d) enter\n",(char *)0x0,0x445);
  }
  iVar13 = mpp_buffer_get_fd_with_caller(task->input,"vepu511_h265_set_hw_address");
  *(int *)((long)__s + 0x134) = iVar13;
  *(int *)((long)__s + 0x138) = iVar13;
  *(int *)((long)__s + 0x13c) = iVar13;
  pHVar18 = hal_bufs_get_buf(*(HalBufs *)((long)hal + 0x400),*(RK_S32 *)(lVar23 + 0x10));
  pHVar19 = hal_bufs_get_buf(*(HalBufs *)((long)hal + 0x400),*(RK_S32 *)(lVar23 + 0x14));
  if (*(int *)(lVar34 + 0x120) == 0) {
    iVar13 = mpp_buffer_get_fd_with_caller(*pHVar18->buf,"vepu511_h265_set_hw_address");
    *(int *)((long)__s + 0x140) = iVar13;
    *(int *)((long)__s + 0x144) = iVar13;
    mpp_dev_multi_offset_update
              (*(MppDevRegOffCfgs **)((long)hal + 0x3b8),0xa4,*(RK_U32 *)((long)hal + 0x408));
  }
  iVar13 = mpp_buffer_get_fd_with_caller(*pHVar19->buf,"vepu511_h265_set_hw_address");
  *(int *)((long)__s + 0x148) = iVar13;
  *(int *)((long)__s + 0x14c) = iVar13;
  iVar13 = mpp_buffer_get_fd_with_caller(pHVar18->buf[2],"vepu511_h265_set_hw_address");
  *(int *)((long)__s + 0x150) = iVar13;
  iVar13 = mpp_buffer_get_fd_with_caller(pHVar19->buf[2],"vepu511_h265_set_hw_address");
  *(int *)((long)__s + 0x154) = iVar13;
  iVar13 = mpp_buffer_get_fd_with_caller(pHVar18->buf[1],"vepu511_h265_set_hw_address");
  *(int *)((long)__s + 0x158) = iVar13;
  iVar13 = mpp_buffer_get_fd_with_caller(pHVar19->buf[1],"vepu511_h265_set_hw_address");
  *(int *)((long)__s + 0x15c) = iVar13;
  mpp_dev_multi_offset_update
            (*(MppDevRegOffCfgs **)((long)hal + 0x3b8),0xa6,*(RK_U32 *)((long)hal + 0x408));
  if (buffer_00 == (MppBuffer)0x0) {
    *(uint *)((long)__s + 0x1b4) = *(uint *)((long)__s + 0x1b4) & 0xfffffff7;
    iVar13 = 0;
  }
  else {
    *(uint *)((long)__s + 0x1b4) = *(uint *)((long)__s + 0x1b4) | 8;
    iVar13 = mpp_buffer_get_fd_with_caller(buffer_00,"vepu511_h265_set_hw_address");
  }
  *(int *)((long)__s + 0x160) = iVar13;
  iVar13 = mpp_buffer_get_fd_with_caller(task->output,"vepu511_h265_set_hw_address");
  *(int *)((long)__s + 0x164) = iVar13;
  *(int *)((long)__s + 0x168) = iVar13;
  *(int *)((long)__s + 0x170) = iVar13;
  *(int *)((long)__s + 0x16c) = iVar13;
  *(undefined8 *)((long)__s + 0x184) = 0xffffffff;
  *(undefined8 *)((long)__s + 0x18c) = 0xffffffff;
  *(undefined4 *)((long)__s + 0x19c) = 0;
  pMVar10 = *(MppDevRegOffCfgs **)((long)hal + 0x3b8);
  sVar20 = mpp_packet_get_length(task->packet);
  mpp_dev_multi_offset_update(pMVar10,0xae,(RK_U32)sVar20);
  pMVar10 = *(MppDevRegOffCfgs **)((long)hal + 0x3b8);
  sVar20 = mpp_buffer_get_size_with_caller(task->output,"vepu511_h265_set_hw_address");
  mpp_dev_multi_offset_update(pMVar10,0xac,(RK_U32)sVar20);
  RVar14 = mpp_frame_get_offset_y(task->frame);
  *(uint *)((long)__s + 0x1e4) =
       *(uint *)((long)__s + 0x1e4) & 0xc000ffff | (RVar14 & 0x3fff) << 0x10;
  RVar14 = mpp_frame_get_offset_x(task->frame);
  *(uint *)((long)__s + 0x1e4) = *(uint *)((long)__s + 0x1e4) & 0xffffc000 | RVar14 & 0x3fff;
  iVar13 = mpp_buffer_get_fd_with_caller(pHVar19->buf[3],"vepu511_h265_set_hw_address");
  *(int *)((long)__s + 0x194) = iVar13;
  iVar13 = mpp_buffer_get_fd_with_caller(pHVar18->buf[3],"vepu511_h265_set_hw_address");
  *(int *)((long)__s + 0x198) = iVar13;
  lVar23 = *(long *)((long)hal + 0x3b0);
  *(uint *)((long)__s + 0x30) = *(uint *)((long)__s + 0x30) & 0xffffff0f | (puVar24[4] & 0xf) << 4;
  uVar26 = *puVar24;
  uVar30 = (*(uint *)((long)__s + 0x1cc) & 0xffffffc3) + (uVar26 & 0xf) * 4;
  *(uint *)((long)__s + 0x1cc) = uVar30;
  uVar37 = puVar24[1];
  *(uint *)((long)__s + 0x1cc) = uVar30 & 0xfffffffe | uVar37 & 1;
  uVar37 = (uVar30 & 0xfffffffc | uVar37 & 1) + (puVar24[2] & 1) * 2;
  *(uint *)((long)__s + 0x1cc) = uVar37;
  *(uint *)((long)__s + 0x1cc) = uVar37 & 0xffffff7f | (uint)(*(int *)(lVar23 + 0x24) != 0xc) << 7;
  uVar30 = (uint)(0 < *(int *)(lVar23 + 0x58)) << 0x1a;
  uVar37 = *(uint *)((long)__s + 0x1e0);
  *(uint *)((long)__s + 0x1e0) = uVar37 & 0xfbffffff | uVar30;
  uVar37 = uVar37 & 0xe3ffffff | uVar30 | (*(uint *)(lVar23 + 0x50) & 3) << 0x1b;
  *(uint *)((long)__s + 0x1e0) = uVar37;
  if ((*(byte *)(lVar23 + 0x26) & 0xf0) == 0) {
    uVar37 = *(uint *)(lVar23 + 0x14);
    if (uVar37 == 0) {
      uVar37 = 0;
      switch(uVar26 & 0xf) {
      case 0:
        uVar37 = *(int *)(lVar23 + 0xc) << 2;
        break;
      case 1:
        uVar37 = *(int *)(lVar23 + 0xc) * 3;
        break;
      case 2:
      case 8:
      case 9:
        uVar37 = *(int *)(lVar23 + 0xc) * 2;
      }
    }
  }
  else {
    *(uint *)((long)__s + 0x1e0) = uVar37 | 0x40000000;
    uVar37 = mpp_frame_get_fbc_hdr_stride(task->frame);
    if (uVar37 == 0) {
      uVar37 = *(int *)(lVar23 + 0x14) + 0x3f >> 2 & 0xfffffff0;
    }
  }
  sVar25 = (short)uVar37;
  switch(*puVar24) {
  case 4:
  case 6:
  case 0xd:
    break;
  default:
    sVar25 = (short)((int)uVar37 / 2);
    break;
  case 0xc:
    sVar25 = sVar25 * 2;
  }
  if ((*(uint *)((long)__s + 0x1cc) & 0x3c) < 0xc) {
    *(uint *)((long)__s + 0x1d0) = *(uint *)((long)__s + 0x1d0) & 0xf8000000 | 0x1352c1d;
    *(uint *)((long)__s + 0x1d4) = *(uint *)((long)__s + 0x1d4) & 0xf8000000 | 0x7575680;
    *(uint *)((long)__s + 0x1d8) = *(uint *)((long)__s + 0x1d8) & 0xf8000000 | 0x2032beb;
    *(uint *)((long)__s + 0x1dc) = *(uint *)((long)__s + 0x1dc) & 0xffe00000 | 0x8080;
  }
  *(uint *)((long)__s + 0x1e8) = *(uint *)((long)__s + 0x1e8) & 0xffe00000 | uVar37 & 0x1fffff;
  *(short *)((long)__s + 0x1ec) = sVar25;
  lVar23 = *(long *)((long)hal + 0x3b0);
  if ((((*(int *)(lVar23 + 0x1868) == 0) || ((*(byte *)(lVar23 + 0x186c) & 1) != 0)) ||
      (*(int *)(lVar23 + 400) != 0)) || (*(int *)(lVar23 + 0x194) != 0)) {
    if (*(int *)((long)hal + 0x374) == 2) {
      bVar12 = *(byte *)(lVar23 + 400);
    }
    else {
      bVar12 = *(byte *)(lVar23 + 0x194);
    }
  }
  else if (*(char *)((long)hal + 0x361) == '\0') {
    bVar12 = 0;
  }
  else if ((*(char *)((long)hal + 0x361) != '\x02') ||
          (bVar12 = 3, *(int *)((long)hal + 0x374) == 2)) {
    bVar12 = 2;
  }
  *(uint *)((long)__s + 0x1f0) =
       (uint)(bVar12 & 3) << 8 |
       (uint)(byte)((bVar12 & 3) << 4) | *(uint *)((long)__s + 0x1f0) & 0xfffffccc |
       (uint)(bVar12 & 3);
  pEVar11 = task->rc_task;
  lVar23 = *(long *)((long)hal + 0x3b0);
  if (*(int *)(lVar23 + 0x94) == 2) {
    *(uint *)((long)__s + 0x1b4) =
         *(uint *)((long)__s + 0x1b4) & 0xffffc0ff | ((pEVar11->info).quality_target & 0x3fU) << 8;
    *(uint *)((long)__s + 0x274) =
         *(uint *)((long)__s + 0x274) & 0xffc0ffff |
         ((pEVar11->info).quality_target & 0x3fU) << 0x10;
    uVar26 = ((pEVar11->info).quality_target & 0x3fU) << 0x14;
    uVar37 = *(uint *)((long)__s + 0x208);
    *(uint *)((long)__s + 0x208) = uVar37 & 0xfc0fffff | uVar26;
    *(uint *)((long)__s + 0x208) =
         uVar37 & 0xfffff | uVar26 | (pEVar11->info).quality_target << 0x1a;
    *(uint *)((long)__s + 0x204) = *(uint *)((long)__s + 0x204) & 0xfff | 0x1000;
  }
  else {
    pvVar9 = (task->syntax).data;
    uVar30 = *(ushort *)((long)pvVar9 + 4) + 0x1f >> 5;
    uVar26 = ((pEVar11->info).bit_target << 4) /
             (int)((*(ushort *)((long)pvVar9 + 6) + 0x1f >> 5) * uVar30);
    uVar37 = 0x50000;
    if (uVar26 < 0x100000) {
      uVar37 = uVar26;
    }
    uVar31 = (uVar37 * uVar30 >> 4) * 5 >> 4;
    uVar27 = *(uint *)((long)__s + 0x1b4) & 0xffffc0ff;
    *(uint *)((long)__s + 0x1b4) = ((pEVar11->info).quality_target & 0x3fU) << 8 | uVar27;
    uVar28 = *(uint *)((long)__s + 0x274) & 0xffc0ffff;
    *(uint *)((long)__s + 0x274) = ((pEVar11->info).quality_target & 0x3fU) << 0x10 | uVar28;
    *(uint *)((long)__s + 0x204) = uVar30 * 0x1000 + (*(uint *)((long)__s + 0x204) & 0xffc) + 3;
    uVar26 = *(uint *)((long)__s + 0x208);
    uVar33 = ((pEVar11->info).quality_max & 0x3fU) << 0x14;
    *(uint *)((long)__s + 0x208) = uVar26 & 0xfc0fffff | uVar33;
    uVar30 = (pEVar11->info).quality_min << 0x1a;
    *(uint *)((long)__s + 0x208) = uVar26 & 0xfffff | uVar33 | uVar30;
    *(uint *)((long)__s + 0x20c) = *(uint *)((long)__s + 0x20c) & 0xfff00000 | uVar37 & 0xfffff;
    if (*(int *)((long)hal + 0x414) == 0) {
      uVar30 = uVar26 & 0xffff | uVar33 | uVar30 |
               (*(uint *)(lVar23 + 0x17c + (ulong)(*(int *)((long)hal + 0x374) == 2) * 4) & 0xf) <<
               0x10;
    }
    else {
      uVar30 = uVar26 & 0xffff | uVar33 | uVar30;
    }
    *(uint *)((long)__s + 0x208) = uVar30;
    uVar22 = (ulong)(*(int *)((long)hal + 0x374) != 2);
    uVar37 = *(uint *)(lVar23 + 0x134 + uVar22 * 4);
    if ((((int)uVar37 < 0x34) && (uVar26 = *(uint *)(lVar23 + 300 + uVar22 * 4), uVar26 == uVar37))
       && (-1 < (int)uVar26)) {
      *(uint *)((long)__s + 0x1b4) = (uVar26 & 0x3f) << 8 | uVar27;
      *(uint *)((long)__s + 0x274) = (uVar26 & 0x3f) << 0x10 | uVar28;
      *(uint *)((long)__s + 0x208) = uVar30 & 0xfff0ffff;
    }
    *(uint *)((long)__s + 0x3f8) = uVar31 * -2;
    *(uint *)((long)__s + 0x3fc) = -uVar31;
    *(uint *)((long)__s + 0x400) = uVar31;
    *(uint *)((long)__s + 0x404) = uVar31 * 2;
    *(undefined8 *)((long)__s + 0x408) = 0x7fffffff7fffffff;
    *(undefined8 *)((long)__s + 0x410) = 0x7fffffff7fffffff;
    *(undefined4 *)((long)__s + 0x418) = 0x7fffffff;
    *(uint *)((long)__s + 0x3f0) = *(uint *)((long)__s + 0x3f0) & 0xfe000000 | 0x2083fe;
    *(uint *)((long)__s + 0x3f4) = *(uint *)((long)__s + 0x3f4) & 0xfff00000;
  }
  uVar37 = (uint)*(byte *)(lVar23 + 0x3b0);
  if (*(byte *)(lVar23 + 0x3b0) == 0) {
    uVar37 = (pEVar11->info).quality_min;
  }
  uVar26 = *(uint *)((long)__s + 0x420);
  uVar37 = uVar37 & 0x3f;
  *(uint *)((long)__s + 0x420) = uVar26 & 0xffffffc0 | uVar37;
  uVar30 = (uint)*(byte *)(lVar23 + 0x3a8);
  if (*(byte *)(lVar23 + 0x3a8) == 0) {
    uVar30 = (pEVar11->info).quality_max;
  }
  uVar31 = (uVar30 & 0x3f) << 6;
  *(uint *)((long)__s + 0x420) = uVar26 & 0xfffff000 | uVar37 | uVar31;
  uVar30 = (uint)*(byte *)(lVar23 + 0x3b1);
  if (*(byte *)(lVar23 + 0x3b1) == 0) {
    uVar30 = (pEVar11->info).quality_min;
  }
  uVar27 = (uVar30 & 0x3f) << 0xc;
  *(uint *)((long)__s + 0x420) = uVar26 & 0xfffc0000 | uVar37 | uVar31 | uVar27;
  uVar30 = (uint)*(byte *)(lVar23 + 0x3a9);
  if (*(byte *)(lVar23 + 0x3a9) == 0) {
    uVar30 = (pEVar11->info).quality_max;
  }
  uVar28 = (uVar30 & 0x3f) << 0x12;
  *(uint *)((long)__s + 0x420) = uVar26 & 0xff000000 | uVar37 | uVar31 | uVar27 | uVar28;
  uVar30 = (uint)*(byte *)(lVar23 + 0x3b2);
  if (*(byte *)(lVar23 + 0x3b2) == 0) {
    uVar30 = (pEVar11->info).quality_min;
  }
  *(uint *)((long)__s + 0x420) =
       uVar26 & 0xc0000000 | uVar37 | uVar31 | uVar27 | uVar28 | (uVar30 & 0x3f) << 0x18;
  uVar37 = (uint)*(byte *)(lVar23 + 0x3aa);
  if (*(byte *)(lVar23 + 0x3aa) == 0) {
    uVar37 = (pEVar11->info).quality_max;
  }
  uVar26 = *(uint *)((long)__s + 0x424);
  uVar37 = uVar37 & 0x3f;
  *(uint *)((long)__s + 0x424) = uVar26 & 0xffffffc0 | uVar37;
  uVar30 = (uint)*(byte *)(lVar23 + 0x3b3);
  if (*(byte *)(lVar23 + 0x3b3) == 0) {
    uVar30 = (pEVar11->info).quality_min;
  }
  uVar31 = (uVar30 & 0x3f) << 6;
  *(uint *)((long)__s + 0x424) = uVar26 & 0xfffff000 | uVar37 | uVar31;
  uVar30 = (uint)*(byte *)(lVar23 + 0x3ab);
  if (*(byte *)(lVar23 + 0x3ab) == 0) {
    uVar30 = (pEVar11->info).quality_max;
  }
  uVar27 = (uVar30 & 0x3f) << 0xc;
  *(uint *)((long)__s + 0x424) = uVar26 & 0xfffc0000 | uVar37 | uVar31 | uVar27;
  uVar30 = (uint)*(byte *)(lVar23 + 0x3b4);
  if (*(byte *)(lVar23 + 0x3b4) == 0) {
    uVar30 = (pEVar11->info).quality_min;
  }
  uVar28 = (uVar30 & 0x3f) << 0x12;
  *(uint *)((long)__s + 0x424) = uVar26 & 0xff000000 | uVar37 | uVar31 | uVar27 | uVar28;
  uVar30 = (uint)*(byte *)(lVar23 + 0x3ac);
  if (*(byte *)(lVar23 + 0x3ac) == 0) {
    uVar30 = (pEVar11->info).quality_max;
  }
  *(uint *)((long)__s + 0x424) =
       uVar26 & 0xc0000000 | uVar37 | uVar31 | uVar27 | uVar28 | (uVar30 & 0x3f) << 0x18;
  uVar37 = (uint)*(byte *)(lVar23 + 0x3b5);
  if (*(byte *)(lVar23 + 0x3b5) == 0) {
    uVar37 = (pEVar11->info).quality_min;
  }
  uVar26 = *(uint *)((long)__s + 0x428);
  uVar37 = uVar37 & 0x3f;
  *(uint *)((long)__s + 0x428) = uVar26 & 0xffffffc0 | uVar37;
  uVar30 = (uint)*(byte *)(lVar23 + 0x3ad);
  if (*(byte *)(lVar23 + 0x3ad) == 0) {
    uVar30 = (pEVar11->info).quality_max;
  }
  uVar31 = (uVar30 & 0x3f) << 6;
  *(uint *)((long)__s + 0x428) = uVar26 & 0xfffff000 | uVar37 | uVar31;
  uVar30 = (uint)*(byte *)(lVar23 + 0x3b6);
  if (*(byte *)(lVar23 + 0x3b6) == 0) {
    uVar30 = (pEVar11->info).quality_min;
  }
  uVar27 = (uVar30 & 0x3f) << 0xc;
  *(uint *)((long)__s + 0x428) = uVar26 & 0xfffc0000 | uVar37 | uVar31 | uVar27;
  uVar30 = (uint)*(byte *)(lVar23 + 0x3ae);
  if (*(byte *)(lVar23 + 0x3ae) == 0) {
    uVar30 = (pEVar11->info).quality_max;
  }
  uVar28 = (uVar30 & 0x3f) << 0x12;
  *(uint *)((long)__s + 0x428) = uVar26 & 0xff000000 | uVar37 | uVar31 | uVar27 | uVar28;
  uVar30 = (uint)*(byte *)(lVar23 + 0x3b7);
  if (*(byte *)(lVar23 + 0x3b7) == 0) {
    uVar30 = (pEVar11->info).quality_min;
  }
  *(uint *)((long)__s + 0x428) =
       uVar26 & 0xc0000000 | uVar37 | uVar31 | uVar27 | uVar28 | (uVar30 & 0x3f) << 0x18;
  uVar37 = (uint)*(byte *)(lVar23 + 0x3af);
  if (*(byte *)(lVar23 + 0x3af) == 0) {
    uVar37 = (pEVar11->info).quality_max;
  }
  *(uint *)((long)__s + 0x42c) = *(uint *)((long)__s + 0x42c) & 0xffffffc0 | uVar37 & 0x3f;
  *(byte *)((long)__s + 0x475) = *(byte *)((long)__s + 0x475) & 0xf0;
  *(undefined8 *)((long)__s + 0x520) = 0xcd08d52a142df7a9;
  *(undefined8 *)((long)__s + 0x528) = 0x1a6e0cc306db2bc5;
  *(undefined8 *)((long)__s + 0x530) = 0x85300097fa51cc1b;
  *(undefined8 *)((long)__s + 0x538) = 0xe33b99add8ab4872;
  *(undefined8 *)((long)__s + 0x540) = 0xc750001393df77fe;
  *(undefined8 *)((long)__s + 0x548) = 0x44456770c1ee3d37;
  *(undefined4 *)((long)__s + 0x550) = 0xfcba9631;
  lVar23 = *(long *)((long)hal + 0x3b0);
  iVar13 = *(int *)((long)hal + 0x374);
  if (*(int *)(lVar23 + 0x18c) == 0) {
    uVar37 = 0x90;
    uVar26 = 0xab;
    if (iVar13 == 2) {
      uVar26 = uVar37;
    }
    uVar30 = 0xdc;
    if (iVar13 == 2) {
      uVar30 = 0xab;
    }
    if (*(int *)((long)hal + 0x414) == 0) {
      uVar37 = 0xab;
      uVar26 = uVar30;
    }
    *(undefined8 *)(lVar23 + 0x2e8) = 0x600000003;
    *(undefined4 *)(lVar23 + 0x2cc) = 3;
    *(undefined8 *)(lVar23 + 0x2d0) = 0xd00000006;
    *(undefined4 *)(lVar23 + 0x2f0) = 0xd;
    *(uint *)(lVar23 + 0x2f4) = uVar37;
    *(uint *)(lVar23 + 0x2d8) = uVar37;
    *(uint *)(lVar23 + 0x2f8) = uVar37;
    *(uint *)(lVar23 + 0x2dc) = uVar37;
    *(uint *)(lVar23 + 0x2fc) = uVar26;
    *(uint *)(lVar23 + 0x2e0) = uVar26;
    *(uint *)(lVar23 + 0x300) = uVar37;
    *(uint *)(lVar23 + 0x2e4) = uVar37;
    *(undefined8 *)(lVar23 + 0x304) = 0x5500000055;
    *(undefined8 *)(lVar23 + 0x30c) = 0x5500000055;
    uVar33 = 3;
    uVar31 = 0xd;
    uVar30 = 6;
    uVar27 = uVar37;
    uVar28 = uVar37;
  }
  else {
    if (iVar13 != 2) {
      uVar33 = (uint)*(byte *)(lVar23 + 0x2e8);
      uVar30 = *(uint *)(lVar23 + 0x2ec);
      uVar31 = *(uint *)(lVar23 + 0x2f0);
      uVar37 = (uint)*(ushort *)(lVar23 + 0x2f4);
      uVar27 = (uint)*(ushort *)(lVar23 + 0x2f8);
      uVar26 = (uint)*(ushort *)(lVar23 + 0x2fc);
      uVar28 = (uint)*(ushort *)(lVar23 + 0x300);
      uVar29 = *(uint *)(lVar23 + 0x304) & 0x3ff;
      uVar41 = (*(uint *)(lVar23 + 0x308) & 0x3ff) << 10;
      uVar38 = (*(uint *)(lVar23 + 0x30c) & 0x3ff) << 0x14;
      uVar40 = *(uint *)(lVar23 + 0x310) & 0x3ff;
      goto LAB_00263b94;
    }
    uVar33 = (uint)*(byte *)(lVar23 + 0x2cc);
    uVar30 = *(uint *)(lVar23 + 0x2d0);
    uVar31 = *(uint *)(lVar23 + 0x2d4);
    uVar37 = (uint)*(ushort *)(lVar23 + 0x2d8);
    uVar26 = (uint)*(ushort *)(lVar23 + 0x2e0);
    uVar27 = (uint)*(ushort *)(lVar23 + 0x2dc);
    uVar28 = (uint)*(ushort *)(lVar23 + 0x2e4);
  }
  uVar41 = 0x15400;
  uVar38 = 0x5500000;
  uVar29 = 0x55;
  uVar40 = 0x55;
LAB_00263b94:
  *(uint *)((long)__s + 0x584) =
       (uVar31 & 0xff) << 0x10 | (uVar30 & 0xff) << 8 | uVar33 |
       (uint)*(byte *)((long)__s + 0x587) << 0x18;
  *(uint *)((long)__s + 0x588) =
       (uVar27 & 0x3ff) << 10 | uVar37 & 0x3ff | (uVar26 & 0x3ff) << 0x14 |
       *(uint *)((long)__s + 0x588) & 0xc0000000;
  *(uint *)((long)__s + 0x58c) = *(uint *)((long)__s + 0x58c) & 0xfffffc00 | uVar28 & 0x3ff;
  *(uint *)((long)__s + 0x590) =
       *(uint *)((long)__s + 0x590) & 0xc0000000 | uVar29 | uVar41 | uVar38;
  *(uint *)((long)__s + 0x594) = *(uint *)((long)__s + 0x594) & 0xfffffc00 | uVar40;
  *(undefined2 *)((long)__s + 0x93a) = 0x404;
  *(undefined4 *)((long)__s + 0x93c) = 0x4040404;
  uVar26 = *(uint *)(lVar7 + 0x24) >> 2 & 1;
  uVar37 = *(uint *)((long)__s + 0x268);
  *(uint *)((long)__s + 0x268) = uVar37 & 0xfffffffe | uVar26;
  uVar30 = (uint)(byte)(*(char *)(lVar7 + 0x1d) * '\x02');
  *(uint *)((long)__s + 0x268) = uVar37 & 0xffffff00 | uVar26 | uVar30;
  uVar31 = (*(byte *)(lVar7 + 0x1e) & 0x3f) << 9;
  *(uint *)((long)__s + 0x268) = uVar37 & 0xffff8100 | uVar26 | uVar30 | uVar31;
  uVar27 = *(uint *)(lVar7 + 0x24) >> 9 & 0x100;
  *(uint *)((long)__s + 0x268) = uVar37 & 0xffff8000 | uVar26 | uVar30 | uVar31 | uVar27;
  uVar28 = *(uint *)(lVar7 + 0x24) >> 3 & 0x8000;
  *(uint *)((long)__s + 0x268) = uVar37 & 0xffff0000 | uVar26 | uVar30 | uVar31 | uVar27 | uVar28;
  uVar33 = (*(uint *)(lVar7 + 0x14) & 0x1e00) << 7;
  *(uint *)((long)__s + 0x268) =
       uVar37 & 0xfff00000 | uVar26 | uVar30 | uVar31 | uVar27 | uVar28 | uVar33;
  *(uint *)((long)__s + 0x268) =
       (uVar37 & 0xffe00000 | uVar26 | uVar30 | uVar31 | uVar27 | uVar28 | uVar33) +
       (*(uint *)(lVar7 + 0x24) & 0x80000) * 2;
  uVar26 = *(uint *)(lVar7 + 0x24) >> 0x14 & 1;
  uVar37 = *(uint *)((long)__s + 0x26c);
  *(uint *)((long)__s + 0x26c) = uVar37 & 0xfffffffe | uVar26;
  uVar30 = *(uint *)(lVar7 + 0x24) >> 0x14 & 2;
  *(uint *)((long)__s + 0x26c) = uVar37 & 0xfffffffc | uVar26 | uVar30;
  uVar31 = *(uint *)(lVar7 + 0x24) >> 0x14 & 0x1c;
  *(uint *)((long)__s + 0x26c) = uVar37 & 0xffffffe0 | uVar26 | uVar30 | uVar31;
  uVar27 = *(uint *)(lVar7 + 0x24) >> 0x14 & 0x20;
  *(uint *)((long)__s + 0x26c) = uVar37 & 0xffffffc0 | uVar26 | uVar30 | uVar31 | uVar27;
  uVar28 = *(uint *)(lVar7 + 0x24) >> 0x14 & 0x40;
  *(uint *)((long)__s + 0x26c) = uVar37 & 0xffffff80 | uVar26 | uVar30 | uVar31 | uVar27 | uVar28;
  uVar33 = (uint)(*(char *)(lVar7 + 0x21) + 0x1aU & 0x3f) << 7;
  *(uint *)((long)__s + 0x26c) =
       uVar37 & 0xffffe000 | uVar26 | uVar30 | uVar31 | uVar27 | uVar28 | uVar33;
  uVar29 = (*(uint *)(lVar7 + 0x28) & 4) << 0xb;
  *(uint *)((long)__s + 0x26c) =
       uVar37 & 0xffffc000 | uVar26 | uVar30 | uVar31 | uVar27 | uVar28 | uVar33 | uVar29;
  uVar40 = (*(uint *)(lVar7 + 0x28) & 8) << 0xb;
  *(uint *)((long)__s + 0x26c) =
       uVar37 & 0xffff8000 | uVar26 | uVar30 | uVar31 | uVar27 | uVar28 | uVar33 | uVar29 | uVar40;
  uVar41 = (*(uint *)(lVar7 + 0x28) & 0x800) << 4;
  *(uint *)((long)__s + 0x26c) =
       uVar37 & 0xffff0000 | uVar26 | uVar30 | uVar31 | uVar27 | uVar28 | uVar33 | uVar29 | uVar40 |
       uVar41;
  uVar38 = (*(uint *)(lVar7 + 0x28) & 0x1000) << 4;
  *(uint *)((long)__s + 0x26c) =
       uVar37 & 0xfffe0000 | uVar26 | uVar30 | uVar31 | uVar27 | uVar28 | uVar33 | uVar29 | uVar40 |
       uVar41 | uVar38;
  uVar37 = (uVar37 & 0xfffc0000 | uVar26 | uVar30 | uVar31 | uVar27 | uVar28 | uVar33 | uVar29 |
            uVar40 | uVar41 | uVar38) + (*(uint *)(lVar7 + 0x28) & 0x4000) * 8;
  *(uint *)((long)__s + 0x26c) = uVar37;
  uVar37 = (uVar37 & 0xfffbffff) + (*(uint *)(lVar7 + 0x28) & 0x8000) * 8;
  *(uint *)((long)__s + 0x26c) = uVar37;
  uVar26 = (*(byte *)(lVar7 + 0xd0) & 3) << 0x13;
  *(uint *)((long)__s + 0x26c) = uVar37 & 0xffe7ffff | uVar26;
  *(uint *)((long)__s + 0x26c) =
       uVar37 & 0xffc7ffff | uVar26 | (*(uint *)(lVar7 + 0x28) & 0x400) << 0xb;
  uVar26 = *(uint *)(lVar7 + 0xe4) >> 4 & 1;
  uVar37 = *(uint *)((long)__s + 0x270);
  *(uint *)((long)__s + 0x270) = uVar37 & 0xfffffffe | uVar26;
  uVar30 = *(uint *)(lVar7 + 0xe4) >> 4 & 2;
  *(uint *)((long)__s + 0x270) = uVar37 & 0xfffffffc | uVar26 | uVar30;
  uVar31 = *(uint *)(lVar7 + 0xe4) >> 3 & 0x20;
  *(uint *)((long)__s + 0x270) = uVar37 & 0xffffffdc | uVar26 | uVar30 | uVar31;
  uVar27 = (uint)(byte)(*(char *)(lVar7 + 0xf0) << 6);
  *(uint *)((long)__s + 0x270) = uVar37 & 0xffffff1c | uVar26 | uVar30 | uVar31 | uVar27;
  uVar28 = (*(byte *)(lVar7 + 0xf1) & 3) << 8;
  *(uint *)((long)__s + 0x270) = uVar37 & 0xfffffc1c | uVar26 | uVar30 | uVar31 | uVar27 | uVar28;
  uVar37 = (uVar37 & 0xfffff81c | uVar26 | uVar30 | uVar31 | uVar27 | uVar28) +
           (*(uint *)(lVar7 + 0xe4) & 0x200) * 2;
  *(uint *)((long)__s + 0x270) = uVar37;
  uVar37 = (uVar37 & 0xfffff7ff) + (*(uint *)(lVar7 + 0xe4) & 0x400) * 2;
  *(uint *)((long)__s + 0x270) = uVar37;
  uVar37 = (uVar37 & 0xffffefff) + (*(uint *)(lVar7 + 0xe4) & 0x800) * 2;
  *(uint *)((long)__s + 0x270) = uVar37;
  uVar37 = (uVar37 & 0xffffdfff) + (*(uint *)(lVar7 + 0xe4) & 0x1000) * 2;
  *(uint *)((long)__s + 0x270) = uVar37;
  *(uint *)((long)__s + 0x1b4) =
       *(uint *)((long)__s + 0x1b4) & 0xfff83fff | (*(uint *)(lVar7 + 0x11c) & 0x1f) << 0xe;
  uVar37 = (uVar37 & 0xffffbfff) + (*(uint *)(lVar7 + 0xe4) & 0x2000) * 2;
  *(uint *)((long)__s + 0x270) = uVar37;
  uVar27 = (*(byte *)(lVar7 + 0xf2) & 3) << 0xf;
  *(uint *)((long)__s + 0x270) = uVar37 & 0xfffe7fff | uVar27;
  uVar28 = (*(byte *)(lVar7 + 0xf3) & 0x7f) << 0x11;
  *(uint *)((long)__s + 0x270) = uVar37 & 0xff007fff | uVar27 | uVar28;
  uVar33 = (*(uint *)(lVar7 + 0xe4) & 0x4000) << 10;
  *(uint *)((long)__s + 0x270) = uVar37 & 0xfe007fff | uVar27 | uVar28 | uVar33;
  uVar29 = (*(byte *)(lVar7 + 0xf4) & 0x3f) << 0x19;
  *(uint *)((long)__s + 0x270) = uVar37 & 0x80007fff | uVar27 | uVar28 | uVar33 | uVar29;
  uVar38 = (*(uint *)(lVar7 + 0xe4) & 0x8000) << 0x10;
  *(uint *)((long)__s + 0x270) = uVar37 & 0x7fff | uVar27 | uVar28 | uVar33 | uVar29 | uVar38;
  uVar26 = *(uint *)((long)__s + 0x274);
  uVar40 = *(byte *)(lVar7 + 0xea) & 0xf;
  *(uint *)((long)__s + 0x274) = uVar26 & 0xfffffff0 | uVar40;
  uVar41 = (uint)(byte)(*(char *)(lVar7 + 0xeb) << 4);
  *(uint *)((long)__s + 0x274) = uVar26 & 0xffffff00 | uVar40 | uVar41;
  uVar42 = *(uint *)(lVar7 + 0xe4) >> 8 & 0x100;
  *(uint *)((long)__s + 0x274) = uVar26 & 0xfffffe00 | uVar40 | uVar41 | uVar42;
  uVar30 = *(uint *)(lVar7 + 0xe4) >> 8 & 0x200;
  *(uint *)((long)__s + 0x274) = uVar26 & 0xfffffc00 | uVar40 | uVar41 | uVar42 | uVar30;
  uVar31 = *(uint *)(lVar7 + 0xe4) >> 8 & 0x400;
  *(uint *)((long)__s + 0x274) = uVar26 & 0xfffff800 | uVar40 | uVar41 | uVar42 | uVar30 | uVar31;
  pbVar21 = (byte *)(lVar7 + 0xec);
  if ((*(byte *)(lVar7 + 0x28) & 8) == 0) {
    pbVar21 = (byte *)(lVar7 + 0x2c);
  }
  uVar30 = (*pbVar21 & 0x1f) * 0x800 +
           (uVar26 & 0xff3f0000 | uVar40 | uVar41 | uVar42 | uVar30 | uVar31) + 0x400000;
  *(uint *)((long)__s + 0x274) = uVar30;
  uVar42 = (*(uint *)(lVar7 + 0xe4) & 0x80000) << 6;
  *(uint *)((long)__s + 0x274) = uVar30 & 0xfd7fffff | uVar42;
  uVar39 = (*(uint *)(lVar7 + 0xe4) & 0x100000) << 6;
  *(uint *)((long)__s + 0x274) = uVar30 & 0xf97fffff | uVar42 | uVar39;
  uVar26 = CONCAT22(*(undefined2 *)((long)__s + 0x27a),*(undefined2 *)(lVar7 + 0xfc));
  *(uint *)((long)__s + 0x278) = uVar26;
  *(uint *)((long)__s + 0x278) = uVar26 & 0xfe00ffff | (*(ushort *)(lVar7 + 0xfe) & 0x1ff) << 0x10;
  uVar31 = *(uint *)(lVar7 + 0xe4) >> 0x15 & 1;
  uVar26 = *(uint *)((long)__s + 0x27c);
  *(uint *)((long)__s + 0x27c) = uVar26 & 0xfffffffe | uVar31;
  uVar26 = (uVar26 & 0xfffe0000 | uVar31) + (uint)*(ushort *)(lVar7 + 0x100) * 2;
  *(uint *)((long)__s + 0x27c) = uVar26;
  *(uint *)((long)__s + 0x27c) = uVar26 & 0xff3fffff | (*(byte *)(lVar7 + 0xf6) & 3) << 0x16;
  uVar26 = (*(uint *)((long)__s + 0x280) & 0xfbffffff) + (*(uint *)(lVar7 + 0xe4) & 0x800000) * 8;
  *(uint *)((long)__s + 0x280) = uVar26;
  uVar31 = (uint)*(ushort *)(lVar7 + 0x106) << 10;
  *(uint *)((long)__s + 0x280) = uVar26 & 0xfc0003ff | uVar31;
  uVar26 = (uVar26 & 0xdc0003ff | uVar31) + (*(uint *)(lVar7 + 0xe4) & 0x4000000) * 8;
  *(uint *)((long)__s + 0x280) = uVar26;
  uVar26 = (uVar26 & 0xbfffffff) + (*(uint *)(lVar7 + 0xe4) & 0x8000000) * 8;
  *(uint *)((long)__s + 0x280) = uVar26;
  uVar26 = (uVar26 & 0x7fffffff) + (*(uint *)(lVar7 + 0xe4) & 0xf0000000) * 8;
  *(uint *)((long)__s + 0x280) = uVar26;
  uVar26 = (uVar26 & 0xfbffffff) + (*(uint *)(lVar7 + 0xe4) & 0x800000) * 8;
  *(uint *)((long)__s + 0x280) = uVar26;
  uVar31 = (uint)*(ushort *)(lVar7 + 0x106) << 10;
  *(uint *)((long)__s + 0x280) = uVar26 & 0xfc0003ff | uVar31;
  uVar26 = (uVar26 & 0xf40003ff | uVar31) + (*(uint *)(lVar7 + 0xe4) & 0x1000000) * 8;
  *(uint *)((long)__s + 0x280) = uVar26;
  uVar31 = (*(byte *)(lVar7 + 0xfa) & 0x1f) << 5;
  *(uint *)((long)__s + 0x280) = uVar26 & 0xfffffc1f | uVar31;
  uVar40 = *(uint *)(lVar7 + 0xe4) >> 0x12 & 0x10;
  *(uint *)((long)__s + 0x280) = uVar26 & 0xfffffc0f | uVar31 | uVar40;
  uVar41 = *(byte *)(lVar7 + 0xf9) & 0xf;
  *(uint *)((long)__s + 0x280) = uVar26 & 0xfffffc00 | uVar31 | uVar40 | uVar41;
  uVar5 = *(undefined2 *)(lVar7 + 0x108);
  *(undefined2 *)((long)__s + 0x284) = uVar5;
  *(uint *)((long)__s + 0x284) = CONCAT22(*(undefined2 *)(lVar7 + 0x10a),uVar5);
  uVar5 = *(undefined2 *)(lVar7 + 0x10c);
  *(undefined2 *)((long)__s + 0x288) = uVar5;
  *(uint *)((long)__s + 0x288) = CONCAT22(*(undefined2 *)(lVar7 + 0x10e),uVar5);
  uVar5 = *(undefined2 *)(lVar7 + 0x110);
  *(undefined2 *)((long)__s + 0x28c) = uVar5;
  uVar6 = *(undefined2 *)(lVar7 + 0x114);
  *(undefined2 *)((long)__s + 0x290) = uVar6;
  *(uint *)((long)__s + 0x28c) = CONCAT22(*(undefined2 *)(lVar7 + 0x112),uVar5);
  *(uint *)((long)__s + 0x280) =
       (uVar26 & 0xeffffc00 | uVar31 | uVar40 | uVar41) + (*(uint *)(lVar7 + 0xe4) & 0x2000000) * 8;
  *(uint *)((long)__s + 0x290) = CONCAT22(*(undefined2 *)(lVar7 + 0x116),uVar6);
  *(uint *)((long)__s + 0x274) =
       uVar30 & 0x817fffff | uVar42 | uVar39 | (*(byte *)(lVar7 + 0xef) & 0xf) << 0x1b;
  *(uint *)((long)__s + 0x270) =
       uVar37 & 0x7fdf | uVar27 | uVar28 | uVar33 | uVar29 | uVar38 |
       *(uint *)(lVar7 + 0xe4) >> 3 & 0x20;
  uVar43 = *(ushort *)(lVar7 + 10);
  if (uVar43 == 0) {
    uVar43 = *(ushort *)(lVar7 + 6);
  }
  uVar4 = *(ushort *)(lVar7 + 8);
  uVar37 = *puVar24;
  pMVar10 = *(MppDevRegOffCfgs **)((long)hal + 0x3b8);
  MVar15 = mpp_frame_get_fmt(task->frame);
  if ((MVar15 & 0xf00000) == MPP_FMT_YUV420SP) {
    offset = (uint)uVar43 * (uint)uVar4;
    switch(uVar37) {
    case 0:
    case 1:
    case 2:
    case 8:
    case 9:
    case 10:
      RVar14 = 0;
      offset = 0;
      break;
    default:
      _mpp_log_l(2,"hal_h265e_v511","unknown color space: %d\n","vepu511_h265_set_patch_info",
                 (ulong)uVar37);
    case 7:
      RVar14 = offset * 5 >> 2;
      break;
    case 4:
    case 6:
    case 0xc:
      RVar14 = offset;
      break;
    case 5:
      RVar14 = offset * 3 >> 1;
      break;
    case 0xd:
      RVar14 = offset * 2;
    }
  }
  else {
    offset = mpp_frame_get_fbc_offset(task->frame);
    RVar14 = offset;
  }
  mpp_dev_multi_offset_update(pMVar10,0xa1,offset);
  mpp_dev_multi_offset_update(pMVar10,0xa2,RVar14);
  if (*(MppBuffer *)((long)hal + 0x428) == (MppBuffer)0x0) {
    *(undefined8 *)((long)__s + 0x17c) = 0;
  }
  else {
    iVar13 = mpp_buffer_get_fd_with_caller
                       (*(MppBuffer *)((long)hal + 0x428),"setup_vepu511_ext_line_buf");
    *(int *)((long)__s + 0x180) = iVar13;
    *(int *)((long)__s + 0x17c) = iVar13;
    mpp_dev_multi_offset_update
              (*(MppDevRegOffCfgs **)((long)hal + 0x3b8),0xb2,*(RK_U32 *)((long)hal + 0x420));
  }
  uVar22 = (ulong)*(uint *)(*(long *)((long)hal + 0x3b0) + 0x189c);
  uVar37 = *(uint *)((long)__s + 0x254);
  *(uint *)((long)__s + 0x254) = uVar37 & 0xefffffff | (uint)(uVar22 != 0) << 0x1c;
  uVar31 = *(ushort *)((long)&vepu511_h265_set_atf_regs_b16_skip_thd2 + uVar22 * 2) & 0xfff;
  *(uint *)((long)__s + 0x888) =
       (*(ushort *)((long)&vepu511_h265_set_atf_regs_b32_skip_thd3 + uVar22 * 2) & 0xfff) << 0x10 |
       *(uint *)((long)__s + 0x888) & 0xf000f000 | uVar31;
  iVar13 = (uint)*(byte *)((long)&vepu511_h265_set_atf_regs_b16_skip_wgt0 + uVar22) +
           (uint)*(byte *)((long)&vepu511_h265_set_atf_regs_b16_skip_wgt3 + uVar22) * 0x1000000 +
           0x101000;
  *(int *)((long)__s + 0x88c) = iVar13;
  *(uint *)((long)__s + 0x884) = *(uint *)((long)__s + 0x884) & 0xf00af005 | 0x600a0005;
  *(uint *)((long)__s + 0x8a4) = *(uint *)((long)__s + 0x8a4) & 0xf000f000 | 0x280014;
  *(uint *)((long)__s + 0x8a8) = *(uint *)((long)__s + 0x8a8) & 0xfffff000 | 0x48;
  *(uint *)((long)__s + 0x8ac) = (uint)*(byte *)((long)__s + 0x8af) << 0x18 | 0x101010;
  uVar27 = *(ushort *)((long)&vepu511_h265_set_atf_regs_b16_intra_thd0 + uVar22 * 2) & 0xfff;
  uVar28 = (*(ushort *)((long)&vepu511_h265_set_atf_regs_b16_intra_thd1 + uVar22 * 2) & 0xfff) <<
           0x10;
  *(uint *)((long)__s + 0x8bc) = *(uint *)((long)__s + 0x8bc) & 0xf000f000 | uVar27 | uVar28;
  uVar33 = *(ushort *)((long)&vepu511_h265_set_atf_regs_b16_intra_thd2 + uVar22 * 2) & 0xfff;
  *(uint *)((long)__s + 0x8c0) = *(uint *)((long)__s + 0x8c0) & 0xfffff000 | uVar33;
  bVar12 = *(byte *)((long)&vepu511_h265_set_atf_regs_b16_intra_wgt0 + uVar22);
  bVar1 = *(byte *)((long)&vepu511_h265_set_atf_regs_b16_intra_wgt1 + uVar22);
  uVar30 = (uint)*(byte *)((long)&vepu511_h265_set_atf_regs_b16_intra_wgt2 + uVar22) * 0x10000;
  *(uint *)((long)__s + 0x8c4) =
       (uint)*(byte *)((long)__s + 0x8c7) << 0x18 | (uint)bVar12 | (uint)bVar1 << 8 | uVar30;
  *(uint *)((long)__s + 0x894) = *(uint *)((long)__s + 0x894) & 0xf000f000 | 0xa0001;
  uVar26 = *(uint *)((long)__s + 0x898);
  *(uint *)((long)__s + 0x898) = uVar26 & 0xfffff000 | uVar31;
  *(uint *)((long)__s + 0x898) =
       uVar26 & 0xf000f000 | uVar31 |
       (*(ushort *)((long)&vepu511_h265_set_atf_regs_b16_skip_thd3 + uVar22 * 2) & 0xfff) << 0x10;
  *(int *)((long)__s + 0x89c) = iVar13;
  *(uint *)((long)__s + 0x8b0) = *(uint *)((long)__s + 0x8b0) & 0xf000f000 | 0x280014;
  *(uint *)((long)__s + 0x8b4) = *(uint *)((long)__s + 0x8b4) & 0xfffff000 | 0x48;
  *(undefined4 *)((long)__s + 0x8b8) = 0x10101010;
  *(uint *)((long)__s + 0x8c8) = *(uint *)((long)__s + 0x8c8) & 0xf000f000 | uVar27 | uVar28;
  *(uint *)((long)__s + 0x8cc) = *(uint *)((long)__s + 0x8cc) & 0xfffff000 | uVar33;
  *(uint *)((long)__s + 0x8d0) = uVar30 + 0x10000000 + (uint)CONCAT11(bVar1,bVar12);
  uVar31 = (uint)(*(int *)(*(long *)((long)hal + 0x3b0) + 0x1884) != 0) << 0x1f;
  uVar26 = *(uint *)((long)__s + 0x960);
  *(uint *)((long)__s + 0x960) = uVar26 & 0x7fffffff | uVar31;
  *(uint *)((long)__s + 0x944) = *(uint *)((long)__s + 0x944) & 0x80808080 | 0x3050f05;
  *(uint *)((long)__s + 0x948) = *(uint *)((long)__s + 0x948) & 0x80808080 | 0x5070603;
  *(uint *)((long)__s + 0x94c) = *(uint *)((long)__s + 0x94c) & 0x80808080 | 0x507050a;
  uVar30 = *(uint *)((long)__s + 0x950);
  *(uint *)((long)__s + 0x950) = uVar30 & 0xfff88080 | 0x50507;
  *(undefined8 *)((long)__s + 0x954) = 0x90d060c12131214;
  *(undefined4 *)((long)__s + 0x95c) = 0x90d060c;
  *(uint *)((long)__s + 0x960) = uVar26 & 0x7f000000 | uVar31 | 0x111112;
  *(uint *)((long)__s + 0x964) = *(uint *)((long)__s + 0x964) & 0x80808080 | 0x3050f05;
  *(uint *)((long)__s + 0x968) = *(uint *)((long)__s + 0x968) & 0x80808080 | 0x5070603;
  *(uint *)((long)__s + 0x96c) = *(uint *)((long)__s + 0x96c) & 0x80808080 | 0x507050a;
  *(uint *)((long)__s + 0x970) = *(uint *)((long)__s + 0x970) & 0xfff88080 | 0x50507;
  *(undefined8 *)((long)__s + 0x974) = 0x90d060c12131214;
  *(undefined4 *)((long)__s + 0x97c) = 0x90d060c;
  *(uint *)((long)__s + 0x950) = uVar30 & 0xfc088080 | 0x1c50507;
  *(uint *)((long)__s + 0x960) = uVar26 & 0x8000000 | uVar31 | 0x45111112;
  *(uint *)((long)__s + 0x980) = *(uint *)((long)__s + 0x980) & 0x88111112 | 0x34111112;
  uVar26 = *(uint *)((long)__s + 0x85c);
  *(uint *)((long)__s + 0x85c) = uVar26 & 0xfffffffe;
  uVar30 = *(uint *)((long)__s + 0x860);
  *(uint *)((long)__s + 0x860) = uVar30 & 0x7fffffff;
  uVar31 = *(uint *)((long)__s + 0x86c);
  *(uint *)((long)__s + 0x86c) = uVar31 & 0xfffffffe;
  *(uint *)((long)__s + 0x824) = *(uint *)((long)__s + 0x824) & 0xfffff800 | 0x86;
  *(uint *)((long)__s + 0x828) = (uint)*(byte *)((long)__s + 0x82b) << 0x18 | 0x102040;
  *(uint *)((long)__s + 0x85c) = uVar26 & 0xf0c0f002 | 0xf270fa0;
  *(uint *)((long)__s + 0x860) = uVar30 & 0x6000e000 | 0x7d01770;
  *(uint *)((long)__s + 0x864) = *(uint *)((long)__s + 0x864) & 0xf800e000 | 0x500012c;
  *(uint *)((long)__s + 0x868) = *(uint *)((long)__s + 0x868) & 0xf800f800 | 0x2000000;
  *(uint *)((long)__s + 0x86c) = uVar31 & 0xc0000000 | 0x21c50506;
  *(uint *)((long)__s + 0x870) = *(uint *)((long)__s + 0x870) & 0xff000080 | 0x464601;
  *(uint *)((long)__s + 0x874) = *(uint *)((long)__s + 0x874) & 0xc0000000 | 0x208a3d1e;
  lVar23 = *(long *)((long)hal + 0x3b0);
  lVar34 = (long)*(int *)(lVar23 + 0x186c);
  uVar26 = *(int *)((long)hal + 0x350) * 1000;
  if (uVar26 < (uint)*(byte *)((long)&vepu511_h265_set_smear_regs_flag_cover_thd0 + lVar34) *
               *(int *)((long)hal + 0x334)) {
    lVar35 = 0;
  }
  else {
    lVar35 = 2 - (ulong)(uVar26 < *(int *)((long)hal + 0x334) *
                                  (uint)*(byte *)((long)&vepu511_h265_set_smear_regs_flag_cover_thd1
                                                 + lVar34));
  }
  iVar13 = 1;
  if (1 < *(int *)(lVar23 + 0xc4)) {
    iVar13 = *(int *)(lVar23 + 0xc4);
  }
  uVar30 = *(int *)((long)hal + 0x3fc) % iVar13;
  uVar26 = 8;
  if (uVar30 < 2) {
    uVar26 = 2;
  }
  *(uint *)((long)__s + 0x834) =
       ((*(byte *)((long)&vepu511_h265_set_smear_regs_smear_strength + lVar34) & 7) << 4 |
        *(uint *)((long)__s + 0x834) & 0xff000080 | *(uint *)(lVar23 + 0x1868) & 1 | uVar26) +
       (uint)(uVar30 != iVar13 - 1U && uVar30 != 0) * 4 | 0xb8a802;
  *(uint *)((long)__s + 0x838) = *(uint *)((long)__s + 0x838) & 0x80000000 | 0x207a8000;
  *(uint *)((long)__s + 0x83c) = *(uint *)((long)__s + 0x83c) & 0xc0000000 | 0x1449088a;
  *(uint *)((long)__s + 0x840) = *(uint *)((long)__s + 0x840) & 0xf000f000 | 0xeef0eef;
  *(uint *)((long)__s + 0x844) = *(uint *)((long)__s + 0x844) & 0xc0c0e0e0 | 0x22301015;
  *(uint *)((long)__s + 0x848) = *(uint *)((long)__s + 0x848) & 0xffc0c0c0 | 0x1b1d20;
  *(uint *)((long)__s + 0x84c) = *(uint *)((long)__s + 0x84c) & 0x8000 | 0x121622cc;
  uVar26 = *(byte *)((long)&vepu511_h265_set_smear_regs_thre_madp_stc_cover1 + lVar34) & 0x3f;
  uVar30 = *(byte *)((long)&vepu511_h265_set_smear_regs_thre_madp_mov_cover1 + lVar34) & 0x1f;
  uVar31 = uVar30 << 0xc;
  uVar30 = uVar30 << 0x11;
  *(uint *)((long)__s + 0x850) =
       uVar30 | uVar31 | uVar26 << 6 | *(uint *)((long)__s + 0x850) & 0xffc00000 | uVar26;
  *(uint *)((long)__s + 0x850) =
       (uVar30 | uVar31 | uVar26 << 6 | uVar26) +
       ((uint)(byte)(&vepu511_h265_set_smear_regs_flag_cover_wgt)[lVar35] +
        (uint)*(byte *)((long)&vepu511_h265_set_smear_regs_qp_strength + lVar34) & 0xf) * 0x400000 +
       0x78000000;
  *(undefined4 *)((long)__s + 0x878) = 0x4038f8df;
  uVar26 = *(uint *)((long)__s + 0x87c);
  *(uint *)((long)__s + 0x87c) = uVar26 & 0xfffffc00 | 0x1ab;
  *(undefined8 *)((long)__s + 0x82c) = 0x775145147720828c;
  *(uint *)((long)__s + 0x87c) = uVar26 & 0xffe00000 | 0x851ab;
  uVar37 = uVar37 >> 0x18 & 3;
  if (((byte)hal_h265e_debug & 1) != 0) {
    _mpp_log_l(4,"hal_h265e_v511","enter\n","vepu511_h265_set_scaling_list");
  }
  if (uVar37 == 2) {
    _mpp_log_l(4,"hal_h265e_v511","scaling_list_mode 2 is not supported yet\n",
               "vepu511_h265_set_scaling_list");
  }
  else if (uVar37 == 1) {
    lVar23 = 0x40;
    lVar34 = 0;
    do {
      uVar2 = (&UNK_002bea9f)[lVar23];
      *(undefined1 *)((long)__s + lVar34 + 0x988) = uVar2;
      uVar37 = (uint)lVar34;
      *(undefined1 *)((long)__s + (ulong)(uVar37 | 0x40) + 0x988) = uVar2;
      *(undefined1 *)((long)__s + (ulong)(uVar37 | 0x80) + 0x988) = uVar2;
      RVar3 = "\x10\x10\x10\x10\x11\x12\x15\x18\x10\x10\x10\x10\x11\x13\x16\x19\x10\x10\x11\x12\x14\x16\x19\x1d\x10\x10\x12\x15\x18\x1b\x1f$\x11\x11\x14\x18\x1e#)/\x12\x13\x16\x1b#,6A\x15\x16\x19\x1f)6FX\x18\x19\x1d$/AXs"
              [lVar23 + 0x3f];
      *(RK_U8 *)((long)__s + (ulong)(uVar37 | 0xc0) + 0x988) = RVar3;
      *(RK_U8 *)((long)__s + (ulong)(uVar37 | 0x100) + 0x988) = RVar3;
      *(RK_U8 *)((long)__s + (ulong)(uVar37 | 0x140) + 0x988) = RVar3;
      *(undefined1 *)((long)__s + (ulong)(uVar37 | 0x180) + 0x988) = uVar2;
      *(undefined1 *)((long)__s + (ulong)(uVar37 | 0x1c0) + 0x988) = uVar2;
      *(undefined1 *)((long)__s + (ulong)(uVar37 | 0x200) + 0x988) = uVar2;
      *(RK_U8 *)((long)__s + (ulong)(uVar37 | 0x240) + 0x988) = RVar3;
      *(RK_U8 *)((long)__s + (ulong)(uVar37 | 0x280) + 0x988) = RVar3;
      *(RK_U8 *)((long)__s + (ulong)(uVar37 | 0x2c0) + 0x988) = RVar3;
      *(undefined1 *)((long)__s + (ulong)(uVar37 | 0x300) + 0x988) = uVar2;
      *(RK_U8 *)((long)__s + (ulong)(uVar37 | 0x340) + 0x988) = RVar3;
      lVar34 = lVar34 + 1;
      lVar23 = lVar23 + -1;
    } while (lVar23 != 0);
    *(undefined8 *)((long)__s + 0xd08) = 0x1010101010101010;
  }
  if (((byte)hal_h265e_debug & 1) != 0) {
    _mpp_log_l(4,"hal_h265e_v511","leave\n","vepu511_h265_set_scaling_list");
  }
  lVar23 = *(long *)((long)hal + 0x3b0);
  iVar13 = *(int *)((long)hal + 0x374);
  lVar34 = (ulong)(iVar13 != 2) * 0x40 + lVar23;
  uVar31 = *(uint *)(lVar34 + 0x218) & 0x1f;
  uVar37 = *(uint *)((long)__s + 0x444);
  uVar26 = *(uint *)((long)__s + 0x448);
  *(uint *)((long)__s + 0x444) = uVar37 & 0xffffffe0 | uVar31;
  uVar27 = (*(uint *)(lVar34 + 0x21c) & 0x1f) << 5;
  *(uint *)((long)__s + 0x444) = uVar37 & 0xfffffc00 | uVar31 | uVar27;
  uVar28 = (*(uint *)(lVar34 + 0x220) & 0x1f) << 10;
  *(uint *)((long)__s + 0x444) = uVar37 & 0xffff8000 | uVar31 | uVar27 | uVar28;
  uVar33 = (*(uint *)(lVar34 + 0x224) & 0x1f) << 0xf;
  *(uint *)((long)__s + 0x444) = uVar37 & 0xfff00000 | uVar31 | uVar27 | uVar28 | uVar33;
  uVar30 = (*(uint *)(lVar34 + 0x228) & 0x1f) << 0x14;
  *(uint *)((long)__s + 0x444) = uVar37 & 0xfe000000 | uVar31 | uVar27 | uVar28 | uVar33 | uVar30;
  *(uint *)((long)__s + 0x444) =
       uVar37 & 0xc0000000 | uVar31 | uVar27 | uVar28 | uVar33 | uVar30 |
       (*(uint *)(lVar34 + 0x22c) & 0x1f) << 0x19;
  uVar37 = *(uint *)(lVar34 + 0x230) & 0x1f;
  *(uint *)((long)__s + 0x448) = uVar26 & 0xffffffe0 | uVar37;
  uVar30 = (*(uint *)(lVar34 + 0x234) & 0x1f) << 5;
  *(uint *)((long)__s + 0x448) = uVar26 & 0xffff8000 | uVar37 | uVar30;
  uVar31 = (*(uint *)(lVar34 + 0x238) & 0x1f) << 0xf;
  *(uint *)((long)__s + 0x448) = uVar26 & 0xfff00000 | uVar37 | uVar30 | uVar31;
  uVar27 = (*(uint *)(lVar34 + 0x23c) & 0x1f) << 0x14;
  *(uint *)((long)__s + 0x448) = uVar26 & 0xfe000000 | uVar37 | uVar30 | uVar31 | uVar27;
  *(uint *)((long)__s + 0x448) =
       uVar26 & 0xc0000000 | uVar37 | uVar30 | uVar31 | uVar27 |
       (*(uint *)(lVar34 + 0x240) & 0x1f) << 0x19;
  uVar31 = *(uint *)(lVar34 + 0x244) & 0x1f;
  uVar37 = *(uint *)((long)__s + 0x44c);
  *(uint *)((long)__s + 0x44c) = uVar37 & 0xffffffe0 | uVar31;
  uVar27 = (*(uint *)(lVar34 + 0x248) & 0x1f) << 5;
  *(uint *)((long)__s + 0x44c) = uVar37 & 0xfffffc00 | uVar31 | uVar27;
  uVar26 = (*(uint *)(lVar34 + 0x24c) & 0x1f) << 10;
  *(uint *)((long)__s + 0x44c) = uVar37 & 0xffff8000 | uVar31 | uVar27 | uVar26;
  uVar30 = (*(uint *)(lVar34 + 0x250) & 0x1f) << 0xf;
  *(uint *)((long)__s + 0x44c) = uVar37 & 0xfff00000 | uVar31 | uVar27 | uVar26 | uVar30;
  *(uint *)((long)__s + 0x44c) =
       uVar37 & 0xfe000000 | uVar31 | uVar27 | uVar26 | uVar30 |
       (*(uint *)(lVar34 + 0x254) & 0x1f) << 0x14;
  lVar35 = 0;
  do {
    *(undefined1 *)((long)__s + lVar35 + 0x434) = *(undefined1 *)(lVar34 + 0x198 + lVar35 * 4);
    lVar35 = lVar35 + 1;
  } while (lVar35 != 0x10);
  puVar24 = (uint *)(lVar23 + 0x314);
  if (iVar13 != 2) {
    puVar24 = (uint *)(lVar23 + 0x328);
  }
  uVar37 = *(uint *)((long)__s + 0x450);
  uVar26 = *puVar24 & 0xf;
  *(uint *)((long)__s + 0x450) = uVar37 & 0xfffffff0 | uVar26;
  uVar30 = (puVar24[1] & 0xf) << 4;
  *(uint *)((long)__s + 0x450) = uVar37 & 0xffffff00 | uVar26 | uVar30;
  uVar31 = (puVar24[2] & 0x1f) << 8;
  *(uint *)((long)__s + 0x450) = uVar37 & 0xffffe000 | uVar26 | uVar30 | uVar31;
  uVar27 = (puVar24[3] & 0x1f) << 0xd;
  *(uint *)((long)__s + 0x450) = uVar37 & 0xfffc0000 | uVar26 | uVar30 | uVar31 | uVar27;
  *(uint *)((long)__s + 0x450) =
       (puVar24[4] & 0x1f) * 0x40000 + (uVar37 & 0xfa800000 | uVar26 | uVar30 | uVar31 | uVar27) +
       0x5000000;
  if (*(long *)((long)hal + 0x3a8) != 0) {
    vepu511_set_osd((Vepu511OsdCfg *)((long)hal + 0x390),(Vepu511Osd *)((long)__s + 0x1428));
  }
  if (*(MppEncROICfg **)((long)hal + 0x388) != (MppEncROICfg *)0x0) {
    vepu511_set_roi((Vepu511RoiCfg *)((long)__s + 0x470),*(MppEncROICfg **)((long)hal + 0x388),
                    *(RK_S32 *)(*(long *)((long)hal + 0x3b0) + 0xc),
                    *(RK_S32 *)(*(long *)((long)hal + 0x3b0) + 0x10));
  }
  iVar13 = *(int *)(*(long *)((long)hal + 0x3b0) + 0x1874);
  *(uint *)((long)__s + 0x294) =
       *(uint *)((long)__s + 0x294) & 0xfffffff8 |
       *(uint *)(*(long *)((long)hal + 0x3b0) + 0x434) & 7;
  if (*(int *)((long)hal + 0x374) == 2) {
    pRVar36 = lambda_tbl_pre_intra;
  }
  else {
    pRVar36 = lambda_tbl_pre_inter;
  }
  memcpy((void *)((long)__s + 0x654),pRVar36,0xd0);
  if (*(int *)((long)hal + 0x374) == 2) {
    pRVar36 = rdo_lambda_table_I;
  }
  else {
    iVar13 = *(int *)(*(long *)((long)hal + 0x3b0) + 0x1878);
    pRVar36 = rdo_lambda_table_P;
  }
  memcpy((void *)((long)__s + 0x754),pRVar36 + iVar13,0xd0);
  *(uint *)((long)__s + 0x454) = (uint)*(byte *)((long)__s + 0x457) << 0x18 | 0x140c05;
  *(uint *)((long)__s + 0x458) = *(uint *)((long)__s + 0x458) & 0xf000f000 | 0x900040;
  *(uint *)((long)__s + 0x45c) = *(uint *)((long)__s + 0x45c) & 0xfffff000 | 0xf0;
  *(uint *)((long)__s + 0x724) = *(uint *)((long)__s + 0x724) & 0xfffffc00 | 0x16b;
  if (((ulong)pEVar8->frm & 4) != 0) {
    uVar32 = *(undefined4 *)(lVar7 + 0x28);
    uVar37 = *(int *)(*(long *)((long)hal + 0x3b0) + 0xc) + 0xfU & 0xfffffff0;
    uVar26 = *(int *)(*(long *)((long)hal + 0x3b0) + 0x10) + 0xfU & 0xfffffff0;
    buffer = (MppBuffer *)((long)hal + 0x430);
    if ((*(long *)((long)hal + 0x430) == 0) &&
       (iVar13 = uVar26 * uVar37,
       mpp_buffer_get_with_tag
                 ((MppBufferGroup)0x0,buffer,(long)((iVar13 >> 1) + iVar13),"hal_h265e_v511",
                  "vepu511_h265e_save_pass1_patch"), *buffer == (MppBuffer)0x0)) {
      _mpp_log_l(2,"hal_h265e_v511","buf_pass1 malloc fail, debreath invaild",(char *)0x0);
    }
    else {
      *(byte *)((long)__s + 0x1b4) = *(byte *)((long)__s + 0x1b4) | 4;
      iVar13 = mpp_buffer_get_fd_with_caller(*buffer,"vepu511_h265e_save_pass1_patch");
      *(int *)((long)__s + 0x140) = iVar13;
      *(int *)((long)__s + 0x144) = iVar13;
      *(byte *)((long)__s + 0x1b7) = *(byte *)((long)__s + 0x1b7) | 0x80;
      if ((char)uVar32 < '\0') {
        *(byte *)((long)__s + 0x26e) = *(byte *)((long)__s + 0x26e) & 0xdf;
      }
      mpp_dev_multi_offset_update(*(MppDevRegOffCfgs **)((long)hal + 0x3b8),0xa4,uVar26 * uVar37);
      *(byte *)((long)__s + 0x214) = *(byte *)((long)__s + 0x214) & 0xfe;
      *(byte *)((long)__s + 0x1b7) = *(byte *)((long)__s + 0x1b7) & 0xbf;
    }
  }
  if (((ulong)pEVar8->frm & 8) != 0) {
    lVar7 = *(long *)((long)hal + 0x3e0);
    iVar13 = *(int *)(*(long *)((long)hal + 0x3b0) + 0x10);
    uVar37 = *(int *)(*(long *)((long)hal + 0x3b0) + 0xc) + 0xf;
    if (((byte)hal_h265e_debug & 1) != 0) {
      _mpp_log_l(4,"hal_h265e_v511","enter\n","vepu511_h265e_use_pass1_patch");
    }
    *(byte *)((long)__s + 0x1b7) = *(byte *)((long)__s + 0x1b7) | 1;
    *(uint *)((long)__s + 0x30) =
         *(uint *)((long)__s + 0x30) & 0xffffff0f | (*(uint *)(lVar7 + 0x10) & 0xf) << 4;
    *(uint *)((long)__s + 0x1cc) = *(uint *)((long)__s + 0x1cc) & 0xffffff40 | 0x98;
    *(uint *)((long)__s + 0x1e8) = *(uint *)((long)__s + 0x1e8) & 0xffe00000 | uVar37 & 0x1ffff0;
    *(ushort *)((long)__s + 0x1ec) = (ushort)uVar37 & 0xfff0;
    *(byte *)((long)__s + 0x1e3) = *(byte *)((long)__s + 0x1e3) & 0xe3;
    iVar16 = mpp_buffer_get_fd_with_caller
                       (*(MppBuffer *)((long)hal + 0x430),"vepu511_h265e_use_pass1_patch");
    *(int *)((long)__s + 0x134) = iVar16;
    *(int *)((long)__s + 0x138) = iVar16;
    MVar17 = mpp_dev_multi_offset_update
                       (*(MppDevRegOffCfgs **)((long)hal + 0x3b8),0xa1,
                        (iVar13 + 0xfU & 0xfffffff0) * (uVar37 & 0xfffffff0));
    if (MVar17 != MPP_OK) {
      _mpp_log_l(2,"hal_h265e_v511","set input cb addr offset failed %d\n",
                 "vepu511_h265e_use_pass1_patch",(ulong)(uint)MVar17);
    }
  }
  *(int *)((long)hal + 0x3fc) = *(int *)((long)hal + 0x3fc) + 1;
  if (((byte)hal_h265e_debug & 4) != 0) {
    _mpp_log_l(4,"hal_h265e_v511","(%d) leave\n",(char *)0x0,0x8bc);
  }
  return MPP_OK;
}

Assistant:

MPP_RET hal_h265e_vepu511_gen_regs(void *hal, HalEncTask *task)
{
    H265eV511HalContext *ctx = (H265eV511HalContext *)hal;
    Vepu511H265eFrmCfg *frm_cfg = ctx->frm;
    H265eV511RegSet *regs = frm_cfg->regs_set;
    MPP_RET ret = MPP_OK;

    HalEncTask *enc_task = task;
    H265eSyntax_new *syn = ctx->syn;
    VepuFmtCfg *fmt = (VepuFmtCfg *)ctx->input_fmt;
    H265eVepu511Frame *reg_frm = &regs->reg_frm;
    EncFrmStatus *frm = &task->rc_task->frm;

    hal_h265e_enter();

    hal_h265e_dbg_simple("frame %d | type %d | start gen regs11",
                         ctx->frame_num, ctx->frame_type);

    memset(regs, 0, sizeof(H265eV511RegSet));

    vepu511_h265_set_normal(ctx, regs);
    vepu511_h265_set_prep(ctx, task, regs);
    vepu511_h265_set_me_regs(ctx, syn , regs);
    vepu511_h265_set_split(regs, ctx->cfg);
    vepu511_h265_set_hw_address(ctx, reg_frm, task);
    vepu511_h265_set_pp_regs(regs, fmt, &ctx->cfg->prep, task);
    vepu511_h265_set_vsp_filtering(ctx, regs);
    vepu511_h265_set_rc_regs(ctx, regs, task);
    vepu511_h265_set_rdo_regs(regs);
    vepu511_h265_set_quant_regs(ctx, regs);
    vepu511_h265_set_sao_regs(regs);
    vepu511_h265_set_slice_regs(syn, reg_frm);
    vepu511_h265_set_ref_regs(syn, reg_frm);

    ret = vepu511_h265_set_patch_info(syn, (Vepu541Fmt)fmt->format, ctx->reg_cfg, enc_task);
    if (ret)
        return ret;

    setup_vepu511_ext_line_buf(ctx, regs);
    vepu511_h265_set_atf_regs(ctx, regs);
    vepu511_h265_set_anti_stripe_regs(ctx, regs);
    vepu511_h265_set_atr_regs(regs);
    vepu511_h265_set_smear_regs(ctx, regs);
    vepu511_h265_set_scaling_list(regs);
    vepu511_h265_set_aq(ctx, regs);

    if (ctx->osd_cfg.osd_data3)
        vepu511_set_osd(&ctx->osd_cfg, &regs->reg_osd.osd_comb_cfg);

    if (ctx->roi_data)
        vepu511_set_roi(&regs->reg_rc_roi.roi_cfg, ctx->roi_data,
                        ctx->cfg->prep.width, ctx->cfg->prep.height);

    /*paramet cfg*/
    vepu511_h265_global_cfg_set(ctx, regs);

    /* two pass register patch */
    if (frm->save_pass1)
        vepu511_h265e_save_pass1_patch(regs, ctx, syn->pp.tiles_enabled_flag);

    if (frm->use_pass1)
        vepu511_h265e_use_pass1_patch(regs, ctx);

    ctx->frame_num++;

    hal_h265e_leave();
    return MPP_OK;
}